

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

success<toml::basic_value<toml::type_config>_> *
toml::ok<toml::basic_value<toml::type_config>>(basic_value<toml::type_config> *v)

{
  basic_value<toml::type_config> *in_RDI;
  value_type *in_stack_fffffffffffffef8;
  basic_value<toml::type_config> *in_stack_ffffffffffffff28;
  basic_value<toml::type_config> *in_stack_ffffffffffffff30;
  
  basic_value<toml::type_config>::basic_value(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  success<toml::basic_value<toml::type_config>_>::success
            ((success<toml::basic_value<toml::type_config>_> *)in_RDI,in_stack_fffffffffffffef8);
  basic_value<toml::type_config>::~basic_value(in_RDI);
  return (success<toml::basic_value<toml::type_config>_> *)in_RDI;
}

Assistant:

success<typename std::decay<T>::type> ok(T&& v)
{
    return success<typename std::decay<T>::type>(std::forward<T>(v));
}